

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O3

bool __thiscall
ON_OffsetSurfaceFunction::SetDistance(ON_OffsetSurfaceFunction *this,int index,double distance)

{
  bool bVar1;
  
  bVar1 = index < (this->m_offset_value).m_count;
  if (bVar1 && -1 < index) {
    (this->m_offset_value).m_a[(uint)index].m_distance = distance;
    this->m_bValid = false;
  }
  return bVar1 && -1 < index;
}

Assistant:

bool ON_OffsetSurfaceFunction::SetDistance( int index, double distance)
{
  int count = m_offset_value.Count();
  if( index < 0 || index > count-1)
    return false;

  m_offset_value[index].m_distance = distance;
  m_bValid = false;

  return true;
}